

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.cpp
# Opt level: O2

void __thiscall embree::QuadMesh::updateBuffer(QuadMesh *this,RTCBufferType type,uint slot)

{
  bool *pbVar1;
  undefined8 *puVar2;
  RawBufferView *pRVar3;
  allocator local_39;
  string local_38 [32];
  
  if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE) {
    if ((this->vertexAttribs).size_active <= (ulong)slot) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar3 = (this->vertexAttribs).items;
  }
  else {
    if (type != RTC_BUFFER_TYPE_VERTEX) {
      if (type != RTC_BUFFER_TYPE_INDEX) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"unknown buffer type",&local_39);
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      if (slot != 0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
        *puVar2 = &PTR__rtcore_error_021d38e0;
        *(undefined4 *)(puVar2 + 1) = 2;
        std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      *(int *)&this->field_0x7c = *(int *)&this->field_0x7c + 1;
      pbVar1 = (bool *)&this->field_0x80;
      goto LAB_001eb026;
    }
    if ((this->vertices).size_active <= (ulong)slot) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_38,"invalid buffer slot",&local_39);
      *puVar2 = &PTR__rtcore_error_021d38e0;
      *(undefined4 *)(puVar2 + 1) = 2;
      std::__cxx11::string::string((string *)(puVar2 + 2),local_38);
      __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
    pRVar3 = &((this->vertices).items)->super_RawBufferView;
  }
  pbVar1 = &pRVar3[slot].modified;
  pRVar3[slot].modCounter = pRVar3[slot].modCounter + 1;
LAB_001eb026:
  *pbVar1 = true;
  Geometry::update(&this->super_Geometry);
  return;
}

Assistant:

void QuadMesh::updateBuffer(RTCBufferType type, unsigned int slot)
  {
    if (type == RTC_BUFFER_TYPE_INDEX)
    {
      if (slot != 0)
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      quads.setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX)
    {
      if (slot >= vertices.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertices[slot].setModified();
    }
    else if (type == RTC_BUFFER_TYPE_VERTEX_ATTRIBUTE)
    {
      if (slot >= vertexAttribs.size())
        throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "invalid buffer slot");
      vertexAttribs[slot].setModified();
    }
    else
    {
      throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "unknown buffer type");
    }

    Geometry::update();
  }